

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugLocateItemOnHover(ImGuiID target_id)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImDrawList *this;
  ImGuiContext *g;
  ImVec2 local_20;
  ImVec2 local_18;
  
  if ((target_id != 0) && (bVar3 = IsItemHovered(0xa0), pIVar2 = GImGui, bVar3)) {
    GImGui->DebugLocateId = target_id;
    pIVar2->DebugLocateFrames = '\x02';
    pIVar2->DebugBreakInLocateId = false;
    this = GetForegroundDrawList();
    IVar1 = (pIVar2->LastItemData).Rect.Min;
    local_18.x = IVar1.x + -3.0;
    local_18.y = IVar1.y + -3.0;
    IVar1 = (pIVar2->LastItemData).Rect.Max;
    local_20.x = IVar1.x + 3.0;
    local_20.y = IVar1.y + 3.0;
    ImDrawList::AddRect(this,&local_18,&local_20,0xff00ff00,0.0,0,1.0);
    if (((pIVar2->IO).ConfigDebugIsDebuggerPresent == true) && (1.0 < pIVar2->MouseStationaryTimer))
    {
      DebugBreakButtonTooltip(false,"in ItemAdd()");
      bVar3 = IsKeyChordPressed(pIVar2->DebugBreakKeyChord);
      if (bVar3) {
        pIVar2->DebugBreakInLocateId = true;
      }
    }
  }
  return;
}

Assistant:

void ImGui::DebugLocateItemOnHover(ImGuiID target_id)
{
    if (target_id == 0 || !IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem | ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        return;
    ImGuiContext& g = *GImGui;
    DebugLocateItem(target_id);
    GetForegroundDrawList(g.CurrentWindow)->AddRect(g.LastItemData.Rect.Min - ImVec2(3.0f, 3.0f), g.LastItemData.Rect.Max + ImVec2(3.0f, 3.0f), DEBUG_LOCATE_ITEM_COLOR);

    // Can't easily use a context menu here because it will mess with focus, active id etc.
    if (g.IO.ConfigDebugIsDebuggerPresent && g.MouseStationaryTimer > 1.0f)
    {
        DebugBreakButtonTooltip(false, "in ItemAdd()");
        if (IsKeyChordPressed(g.DebugBreakKeyChord))
            g.DebugBreakInLocateId = true;
    }
}